

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O3

void __thiscall
randomx::CompiledLightVm<randomx::LargePageAllocator,_true,_true>::run
          (CompiledLightVm<randomx::LargePageAllocator,_true,_true> *this,void *seed)

{
  JitCompiler *this_00;
  
  VmBase<randomx::LargePageAllocator,_true>::generateProgram
            ((VmBase<randomx::LargePageAllocator,_true> *)this,seed);
  randomx_vm::initialize((randomx_vm *)this);
  this_00 = &(this->super_CompiledVm<randomx::LargePageAllocator,_true,_true>).compiler;
  JitCompilerX86::enableWriting(this_00);
  JitCompilerX86::generateProgramLight
            (this_00,(Program *)
                     &(this->super_CompiledVm<randomx::LargePageAllocator,_true,_true>).field_0x40,
             (ProgramConfiguration *)
             &(this->super_CompiledVm<randomx::LargePageAllocator,_true,_true>).field_0x9c0,
             *(uint32_t *)
              &(this->super_CompiledVm<randomx::LargePageAllocator,_true,_true>).field_0xa00);
  JitCompilerX86::enableExecution(this_00);
  CompiledVm<randomx::LargePageAllocator,_true,_true>::execute
            (&this->super_CompiledVm<randomx::LargePageAllocator,_true,_true>);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgramLight(program, config, datasetOffset);
		if (secureJit) {
			compiler.enableExecution();
		}
		CompiledVm<Allocator, softAes, secureJit>::execute();
	}